

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoInput.cpp
# Opt level: O0

Key PianoInputTU::readBinding(QSettings *settings,QString *keyname)

{
  bool bVar1;
  int iVar2;
  KeyboardModifiers lhs;
  QKeyCombination local_90 [2];
  QKeyCombination combo;
  QVariant local_80;
  QVariant local_60;
  QString local_40;
  QKeySequence local_28 [8];
  QKeySequence seq;
  QString *keyname_local;
  QSettings *settings_local;
  
  _seq = keyname;
  QVariant::QVariant(&local_80);
  QSettings::value((QString *)&local_60,(QVariant *)settings);
  QVariant::toString();
  QKeySequence::QKeySequence(local_28,(QString *)&local_40,PortableText);
  QString::~QString(&local_40);
  QVariant::~QVariant(&local_60);
  QVariant::~QVariant(&local_80);
  iVar2 = QKeySequence::count();
  if (iVar2 == 1) {
    local_90[0].combination = QKeySequence::operator[]((uint)local_28);
    lhs = QKeyCombination::keyboardModifiers(local_90);
    bVar1 = ::operator==((QFlags<Qt::KeyboardModifier>)lhs.i,NoModifier);
    if (bVar1) {
      settings_local._4_4_ = QKeyCombination::key(local_90);
      goto LAB_0015b384;
    }
  }
  settings_local._4_4_ = 0;
LAB_0015b384:
  QKeySequence::~QKeySequence(local_28);
  return settings_local._4_4_;
}

Assistant:

static Qt::Key readBinding(QSettings &settings, QString const& keyname) {
    QKeySequence seq(settings.value(keyname).toString(), QKeySequence::PortableText);
    // the key sequence must be 1 key and have no keyboard modifiers
    if (seq.count() == 1) {
        auto const combo = seq[0];
        if (combo.keyboardModifiers() == Qt::NoModifier) {
            return combo.key();
        }

    }

    return PianoInput::NoKey;

}